

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

void gguf_set_val_i16(gguf_context *ctx,char *key,int16_t val)

{
  bool bVar1;
  int16_t local_44;
  allocator<char> local_41;
  char *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_44 = val;
  local_40 = key;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,key,&local_41);
  bVar1 = std::operator==(&local_38,"general.alignment");
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&local_38);
    gguf_remove_key(ctx,key);
    std::vector<gguf_kv,std::allocator<gguf_kv>>::emplace_back<char_const*&,short&>
              ((vector<gguf_kv,std::allocator<gguf_kv>> *)&ctx->kv,&local_40,&local_44);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",0x3a8
             ,"general.alignment must be type u32");
}

Assistant:

void gguf_set_val_i16(struct gguf_context * ctx, const char * key, int16_t val) {
    gguf_check_reserved_keys(key, val);
    gguf_remove_key(ctx, key);
    ctx->kv.emplace_back(key, val);
}